

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void P_DoDeferedScripts(void)

{
  acsdefered_t *paVar1;
  EType EVar2;
  acsdefered_t *paVar3;
  ScriptPtr *code;
  ulong uVar4;
  int script;
  AActor *who;
  uint uVar5;
  FString local_40;
  FBehavior *module;
  
  uVar5 = ((level.info)->deferred).Count;
LAB_003d47f1:
  while( true ) {
    uVar5 = uVar5 - 1;
    if ((int)uVar5 < 0) {
      TArray<acsdefered_t,_acsdefered_t>::Clear(&(level.info)->deferred);
      return;
    }
    paVar3 = ((level.info)->deferred).Array;
    paVar1 = paVar3 + (uVar5 & 0x7fffffff);
    EVar2 = paVar3[uVar5 & 0x7fffffff].type;
    script = (int)&local_40;
    if (defexealways < EVar2) break;
    code = FBehavior::StaticFindScript(paVar1->script,&module);
    if (code == (ScriptPtr *)0x0) {
      ScriptPresentation(script);
      Printf("P_DoDeferredScripts: Unknown %s\n",local_40.Chars);
      goto LAB_003d4912;
    }
    uVar4 = (ulong)(uint)paVar1->playernum;
    if ((uVar4 < 8) && (playeringame[uVar4] == true)) {
      who = (AActor *)(&players)[uVar4 * 0x54];
    }
    else {
      who = (AActor *)0x0;
    }
    P_GetScriptGoing(who,(line_t_conflict *)0x0,paVar1->script,code,module,paVar1->args,3,
                     (uint)(paVar1->type == defexealways) * 2);
  }
  if (EVar2 == defsuspend) {
    SetScriptState(paVar1->script,SCRIPT_Suspended);
    ScriptPresentation(script);
    DPrintf(4,"Deferred suspend of %s\n",local_40.Chars);
  }
  else {
    if (EVar2 != defterminate) goto LAB_003d47f1;
    SetScriptState(paVar1->script,SCRIPT_PleaseRemove);
    ScriptPresentation(script);
    DPrintf(4,"Deferred terminate of %s\n",local_40.Chars);
  }
LAB_003d4912:
  FString::~FString(&local_40);
  goto LAB_003d47f1;
}

Assistant:

void P_DoDeferedScripts ()
{
	const ScriptPtr *scriptdata;
	FBehavior *module;

	// Handle defered scripts in this step, too
	for(int i = level.info->deferred.Size()-1; i>=0; i--)
	{
		acsdefered_t *def = &level.info->deferred[i];
		switch (def->type)
		{
		case acsdefered_t::defexecute:
		case acsdefered_t::defexealways:
			scriptdata = FBehavior::StaticFindScript (def->script, module);
			if (scriptdata)
			{
				P_GetScriptGoing ((unsigned)def->playernum < MAXPLAYERS &&
					playeringame[def->playernum] ? players[def->playernum].mo : NULL,
					NULL, def->script,
					scriptdata, module,
					def->args, 3,
					def->type == acsdefered_t::defexealways ? ACS_ALWAYS : 0);
			}
			else
			{
				Printf ("P_DoDeferredScripts: Unknown %s\n", ScriptPresentation(def->script).GetChars());
			}
			break;

		case acsdefered_t::defsuspend:
			SetScriptState (def->script, DLevelScript::SCRIPT_Suspended);
			DPrintf (DMSG_SPAMMY, "Deferred suspend of %s\n", ScriptPresentation(def->script).GetChars());
			break;

		case acsdefered_t::defterminate:
			SetScriptState (def->script, DLevelScript::SCRIPT_PleaseRemove);
			DPrintf (DMSG_SPAMMY, "Deferred terminate of %s\n", ScriptPresentation(def->script).GetChars());
			break;
		}
	}
	level.info->deferred.Clear();
}